

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cinatra.cpp
# Opt level: O1

bool __thiscall add_data::before(add_data *this,coro_http_request *req,coro_http_response *res)

{
  shared_ptr<int> val;
  any local_38;
  shared_ptr<int> local_28;
  
  cinatra::coro_http_request::set_aspect_data<char_const*>(req,"hello world");
  local_28.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_28.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (local_28.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count = 1
  ;
  (local_28.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count =
       1;
  (local_28.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0035fdf0;
  local_28.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_28.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
  *(undefined4 *)
   &local_28.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _vptr__Sp_counted_base = 0x2a;
  local_38._M_manager = std::any::_Manager_external<std::shared_ptr<int>_>::_S_manage;
  local_38._M_storage._M_ptr = (void *)0x0;
  std::any::_Manager_external<std::shared_ptr<int>>::_S_create<std::shared_ptr<int>&>
            (&local_38._M_storage,&local_28);
  std::any::operator=(&req->user_data_,&local_38);
  if (local_38._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_38._M_manager)(_Op_destroy,&local_38,(_Arg *)0x0);
    local_38._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_28.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return true;
}

Assistant:

bool before(coro_http_request &req, coro_http_response &res) {
    req.set_aspect_data("hello world");
    auto val = std::make_shared<int>(42);
    req.set_user_data(val);
    return true;
  }